

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

void luaE_shrinkCI(lua_State *L)

{
  CallInfo *block;
  CallInfo *pCVar1;
  CallInfo *pCVar2;
  
  block = L->ci->next;
  pCVar2 = L->ci;
  while( true ) {
    if (block == (CallInfo *)0x0) {
      return;
    }
    pCVar1 = block->next;
    if (pCVar1 == (CallInfo *)0x0) break;
    luaM_realloc_(L,block,0x48,0);
    L->nci = L->nci - 1;
    pCVar2->next = pCVar1;
    pCVar1->previous = pCVar2;
    block = pCVar1->next;
    pCVar2 = pCVar1;
  }
  return;
}

Assistant:

void luaE_shrinkCI(lua_State *L) {
    CallInfo *ci = L->ci;
    CallInfo *next2;  /* next's next */
    /* while there are two nexts */
    while (ci->next != NULL && (next2 = ci->next->next) != NULL) {
        luaM_free(L, ci->next);  /* free next */
        L->nci--;
        ci->next = next2;  /* remove 'next' from the list */
        next2->previous = ci;
        ci = next2;  /* keep next's next */
    }
}